

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createOp
          (Builder *this,Op opCode,Id typeId,
          vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *operands)

{
  const_iterator this_00;
  bool bVar1;
  Id IVar2;
  Instruction *this_01;
  size_type count;
  pointer pIVar3;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  __normal_iterator<const_spv::IdImmediate_*,_std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>_>
  local_38;
  __normal_iterator<const_spv::IdImmediate_*,_std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>_>
  local_30;
  const_iterator it;
  Instruction *op;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *operands_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  this_01 = (Instruction *)::operator_new(0x60);
  IVar2 = getUniqueId(this);
  spv::Instruction::Instruction(this_01,IVar2,typeId,opCode);
  it._M_current = (IdImmediate *)this_01;
  count = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::size(operands);
  spv::Instruction::reserveOperands(this_01,count);
  local_30._M_current =
       (IdImmediate *)
       std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::cbegin(operands);
  while( true ) {
    local_38._M_current =
         (IdImmediate *)
         std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::cend(operands);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_spv::IdImmediate_*,_std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>_>
             ::operator->(&local_30);
    this_00 = it;
    if ((pIVar3->isId & 1U) == 0) {
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_spv::IdImmediate_*,_std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>_>
               ::operator->(&local_30);
      spv::Instruction::addImmediateOperand((Instruction *)this_00._M_current,pIVar3->word);
    }
    else {
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_spv::IdImmediate_*,_std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>_>
               ::operator->(&local_30);
      spv::Instruction::addIdOperand((Instruction *)this_00._M_current,pIVar3->word);
    }
    __gnu_cxx::
    __normal_iterator<const_spv::IdImmediate_*,_std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>_>
    ::operator++(&local_30);
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_40,
             (pointer)it._M_current);
  addInstruction(this,&local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_40);
  IVar2 = spv::Instruction::getResultId((Instruction *)it._M_current);
  return IVar2;
}

Assistant:

Id Builder::createOp(Op opCode, Id typeId, const std::vector<IdImmediate>& operands)
{
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->reserveOperands(operands.size());
    for (auto it = operands.cbegin(); it != operands.cend(); ++it) {
        if (it->isId)
            op->addIdOperand(it->word);
        else
            op->addImmediateOperand(it->word);
    }
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}